

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FACopyDescriptor.H
# Opt level: O0

void __thiscall
amrex::FabArrayCopyDescriptor<amrex::FArrayBox>::AddBoxDoIt
          (FabArrayCopyDescriptor<amrex::FArrayBox> *this,FabArrayId fabarrayid,Box *destFabBox,
          BoxList *returnedUnfilledBoxes,int faindex,int srccomp,int destcomp,int numcomp,
          bool bUseValidBox,BoxDomain *unfilledBoxDomain)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  reference ppFVar4;
  FabCopyDescriptor<amrex::FArrayBox> *pFVar5;
  FArrayBox *pFVar6;
  value_type *__x;
  long in_RCX;
  int *in_RDX;
  vector<amrex::FabArray<amrex::FArrayBox>_*,_std::allocator<amrex::FabArray<amrex::FArrayBox>_*>_>
  *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  byte in_stack_00000018;
  FabComTag fabComTag;
  int remoteProc;
  FabCopyDescriptor<amrex::FArrayBox> *fcd;
  Box intersect;
  FabArray<amrex::FArrayBox> *fabArray;
  int myProc;
  string *in_stack_fffffffffffffd98;
  multimap<int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>_>
  *this_00;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffda0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  FArrayBox *in_stack_fffffffffffffdb0;
  FabArrayBase *in_stack_fffffffffffffdd0;
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>_(*)()>,_true>
  *in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffdec;
  string local_1c8 [32];
  string local_1a8 [32];
  Box *in_stack_fffffffffffffe78;
  DataAllocator in_stack_fffffffffffffe80;
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  int local_a8;
  FabCopyDescriptor<amrex::FArrayBox> *local_98;
  Box local_8c;
  Box local_70;
  Box local_54;
  value_type local_38;
  int local_30;
  byte local_29;
  int local_28;
  int local_24;
  long local_20;
  int *local_18;
  FabArrayId local_4;
  
  local_29 = in_stack_00000018 & 1;
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_30 = ParallelDescriptor::MyProc();
  iVar2 = FabArrayId::Id(&local_4);
  ppFVar4 = std::
            vector<amrex::FabArray<amrex::FArrayBox>_*,_std::allocator<amrex::FabArray<amrex::FArrayBox>_*>_>
            ::operator[](in_RDI,(long)iVar2);
  local_38 = *ppFVar4;
  local_54.smallend.vect._0_8_ = *(undefined8 *)local_18;
  local_54.smallend.vect[2] = local_18[2];
  local_54.bigend.vect[0] = local_18[3];
  local_54.bigend.vect._4_8_ = *(undefined8 *)(local_18 + 4);
  local_54.btype.itype = local_18[6];
  if ((local_29 & 1) == 0) {
    FabArrayBase::fabbox(in_stack_fffffffffffffdd0,(int)((ulong)in_RDI >> 0x20));
    Box::operator&=(&local_54,&local_8c);
  }
  else {
    FabArrayBase::box(&in_stack_fffffffffffffda0->super_FabArrayBase,
                      (int)((ulong)in_stack_fffffffffffffd98 >> 0x20));
    Box::operator&=(&local_54,&local_70);
  }
  bVar1 = Box::ok(&local_54);
  if (bVar1) {
    pFVar5 = (FabCopyDescriptor<amrex::FArrayBox> *)operator_new(0x48);
    FabCopyDescriptor<amrex::FArrayBox>::FabCopyDescriptor
              ((FabCopyDescriptor<amrex::FArrayBox> *)in_stack_fffffffffffffda0);
    local_98 = pFVar5;
    FabArrayBase::DistributionMap(&local_38->super_FabArrayBase);
    iVar2 = DistributionMapping::operator[]
                      ((DistributionMapping *)in_stack_fffffffffffffda0,
                       (int)((ulong)in_stack_fffffffffffffd98 >> 0x20));
    local_a8 = iVar2;
    iVar3 = ParallelDescriptor::NProcs();
    if (iVar3 <= iVar2) {
      ParallelDescriptor::MyProc();
      in_stack_fffffffffffffdb0 = (FArrayBox *)&stack0xfffffffffffffe78;
      std::__cxx11::to_string(in_stack_fffffffffffffdec);
      std::operator+((char *)in_stack_fffffffffffffda8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffda0);
      std::operator+(in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0);
      ParallelDescriptor::NProcs();
      std::__cxx11::to_string(in_stack_fffffffffffffdec);
      std::operator+(in_stack_fffffffffffffdd8,
                     (_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>_(*)()>,_true>
                      *)in_stack_fffffffffffffdd0);
      std::operator+(in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0);
      std::__cxx11::to_string(in_stack_fffffffffffffdec);
      std::operator+(in_stack_fffffffffffffdd8,
                     (_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>_(*)()>,_true>
                      *)in_stack_fffffffffffffdd0);
      std::operator+(in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0);
      Abort(in_stack_fffffffffffffd98);
      std::__cxx11::string::~string(local_c8);
      std::__cxx11::string::~string(local_e8);
      std::__cxx11::string::~string(local_1c8);
      std::__cxx11::string::~string(local_108);
      std::__cxx11::string::~string(local_128);
      std::__cxx11::string::~string(local_1a8);
      std::__cxx11::string::~string(local_148);
      std::__cxx11::string::~string(local_168);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe78);
    }
    local_98->fillBoxId =
         *(int *)&in_RDI[3].
                  super__Vector_base<amrex::FabArray<amrex::FArrayBox>_*,_std::allocator<amrex::FabArray<amrex::FArrayBox>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)(local_98->subBox).smallend.vect = local_54.smallend.vect._0_8_;
    *(undefined8 *)((local_98->subBox).smallend.vect + 2) = local_54._8_8_;
    *(undefined8 *)((local_98->subBox).bigend.vect + 1) = local_54.bigend.vect._4_8_;
    (local_98->subBox).btype.itype = local_54.btype.itype;
    local_98->myProc = local_30;
    local_98->copyFromProc = local_a8;
    local_98->copyFromIndex = local_24;
    local_98->srcComp = local_28;
    local_98->destComp = in_stack_00000008;
    local_98->nComp = in_stack_00000010;
    bVar1 = ParallelDescriptor::sameTeam(0);
    if (bVar1) {
      local_98->fillType = FillLocally;
      pFVar6 = FabArray<amrex::FArrayBox>::operator[]
                         (in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20))
      ;
      local_98->localFabSource = pFVar6;
    }
    else {
      FabArrayBase::FabComTag::FabComTag((FabComTag *)0x8572cc);
      *(undefined1 *)
       ((long)&in_RDI[3].
               super__Vector_base<amrex::FabArray<amrex::FArrayBox>_*,_std::allocator<amrex::FabArray<amrex::FArrayBox>_*>_>
               ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
      local_98->fillType = FillRemotely;
      __x = (value_type *)operator_new(0x48);
      FArrayBox::FArrayBox
                (in_stack_fffffffffffffdb0,(Box *)__x,
                 (int)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffda0 >> 0x18,0),
                 SUB81((ulong)in_stack_fffffffffffffda0 >> 0x10,0),
                 (Arena *)in_stack_fffffffffffffd98);
      local_98->localFabSource = (FArrayBox *)__x;
      local_98->cacheDataAllocated = true;
      FabArrayId::Id(&local_4);
      std::vector<amrex::FabArrayBase::FabComTag,_std::allocator<amrex::FabArrayBase::FabComTag>_>::
      push_back((vector<amrex::FabArrayBase::FabComTag,_std::allocator<amrex::FabArrayBase::FabComTag>_>
                 *)in_stack_fffffffffffffdb0,__x);
    }
    this_00 = (multimap<int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>_>
               *)(in_RDI + 1);
    iVar2 = FabArrayId::Id(&local_4);
    std::
    vector<std::multimap<int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>_>,_std::allocator<std::multimap<int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>_>_>_>
    ::operator[]((vector<std::multimap<int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>_>,_std::allocator<std::multimap<int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>_>_>_>
                  *)this_00,(long)iVar2);
    std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>::
    pair<int_&,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*&,_true>
              ((pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*> *)
               &stack0xfffffffffffffdd8,&local_98->fillBoxId,&local_98);
    std::
    multimap<int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>_>
    ::insert(this_00,(value_type *)0x857466);
    if (local_20 != 0) {
      BoxDomain::rmBox((BoxDomain *)in_stack_fffffffffffffe80.m_arena,in_stack_fffffffffffffe78);
    }
  }
  return;
}

Assistant:

void
FabArrayCopyDescriptor<FAB>::AddBoxDoIt (FabArrayId fabarrayid,
                                         const Box& destFabBox,
                                         BoxList*   returnedUnfilledBoxes,
                                         int        faindex,
                                         int        srccomp,
                                         int        destcomp,
                                         int        numcomp,
                                         bool       bUseValidBox,
                                         BoxDomain& unfilledBoxDomain)
{
    const int myProc = ParallelDescriptor::MyProc();

    FabArray<FAB>* fabArray = fabArrays[fabarrayid.Id()];

    BL_ASSERT(faindex >= 0 && faindex < fabArray->size());

    Box intersect = destFabBox;

    if (bUseValidBox)
    {
        intersect &= fabArray->box(faindex);
    }
    else
    {
        intersect &= fabArray->fabbox(faindex);
    }

    if (intersect.ok())
    {
        FabCopyDescriptor<FAB>* fcd = new FabCopyDescriptor<FAB>;

        int remoteProc     = fabArray->DistributionMap()[faindex];
        if(remoteProc >= ParallelDescriptor::NProcs()) {
            amrex::Abort("Bad remoteProc: "
                         + std::to_string(ParallelDescriptor::MyProc())
                         + ":: _in AddBoxDoIt:  nProcs remoteProc = "
                         + std::to_string(ParallelDescriptor::NProcs())
                         + "  " + std::to_string(remoteProc) + "\n");
        }
        fcd->fillBoxId     = nextFillBoxId;
        fcd->subBox        = intersect;
        fcd->myProc        = myProc;
        fcd->copyFromProc  = remoteProc;
        fcd->copyFromIndex = faindex;
        fcd->srcComp       = srccomp;
        fcd->destComp      = destcomp;
        fcd->nComp         = numcomp;

        if (ParallelDescriptor::sameTeam(remoteProc))
        {
            //
            // Data is local.
            //
            fcd->fillType       = FillLocally;
            fcd->localFabSource = &(*fabArray)[faindex];
        }
        else
        {
            //
            // Data is remote.
            //
            FabArrayBase::FabComTag fabComTag;

            dataAvailable               = false;
            fcd->fillType               = FillRemotely;
            fcd->localFabSource         = new FAB(intersect, numcomp);
            fcd->cacheDataAllocated     = true;
            fabComTag.fabArrayId        = fabarrayid.Id();
            fabComTag.fillBoxId         = nextFillBoxId;
            fabComTag.fabIndex          = faindex;
            fabComTag.procThatNeedsData = myProc;
            fabComTag.procThatHasData   = remoteProc;
            fabComTag.box               = intersect;
            fabComTag.srcComp           = srccomp;
            fabComTag.destComp          = destcomp;
            fabComTag.nComp             = numcomp;
            //
            // Do not send the data yet.
            //
            fabComTagList.push_back(fabComTag);
        }

        fabCopyDescList[fabarrayid.Id()].insert(FCDMapValueType(fcd->fillBoxId,fcd));

        if (returnedUnfilledBoxes != 0)
        {
            unfilledBoxDomain.rmBox(intersect);
        }
    }
}